

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_rope_yarn_corr_dims
               (int n_dims,int n_ctx_orig,float freq_base,float beta_fast,float beta_slow,
               float *dims)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = logf((float)n_ctx_orig / ((beta_fast + beta_fast) * 3.1415927));
  fVar2 = logf(freq_base);
  fVar2 = floorf((fVar1 * (float)n_dims) / (fVar2 + fVar2));
  fVar1 = logf((float)n_ctx_orig / ((beta_slow + beta_slow) * 3.1415927));
  fVar3 = logf(freq_base);
  fVar3 = ceilf((fVar1 * (float)n_dims) / (fVar3 + fVar3));
  fVar1 = 0.0;
  if (0.0 <= fVar2) {
    fVar1 = fVar2;
  }
  *dims = fVar1;
  fVar1 = (float)(n_dims + -1);
  if (fVar3 <= (float)(n_dims + -1)) {
    fVar1 = fVar3;
  }
  dims[1] = fVar1;
  return;
}

Assistant:

void ggml_rope_yarn_corr_dims(
    int n_dims, int n_ctx_orig, float freq_base, float beta_fast, float beta_slow, float dims[2]
) {
    // start and end correction dims
    float start = floorf(ggml_rope_yarn_corr_dim(n_dims, n_ctx_orig, beta_fast, freq_base));
    float end   =  ceilf(ggml_rope_yarn_corr_dim(n_dims, n_ctx_orig, beta_slow, freq_base));
    dims[0] = MAX(0, start);
    dims[1] = MIN(n_dims - 1, end);
}